

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

int Dch_ClassesRefineOneClass(Dch_Cla_t *p,Aig_Obj_t *pReprOld,int fRecursive)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **pClass;
  Aig_Obj_t *pAVar3;
  long lVar4;
  Aig_Obj_t *local_90;
  Aig_Obj_t *local_70;
  int local_4c;
  int i;
  Aig_Obj_t *pReprNew;
  Aig_Obj_t *pObj;
  Aig_Obj_t **pClassNew;
  Aig_Obj_t **pClassOld;
  int fRecursive_local;
  Aig_Obj_t *pReprOld_local;
  Dch_Cla_t *p_local;
  
  Vec_PtrClear(p->vClassOld);
  Vec_PtrClear(p->vClassNew);
  for (local_4c = 0; local_4c < p->pClassSizes[pReprOld->Id]; local_4c = local_4c + 1) {
    pAVar2 = p->pId2Class[pReprOld->Id][local_4c];
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      iVar1 = (*p->pFuncNodesAreEqual)(p->pManData,pReprOld,pAVar2);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar2);
      }
      else {
        Vec_PtrPush(p->vClassOld,pAVar2);
      }
    }
  }
  iVar1 = Vec_PtrSize(p->vClassNew);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0);
    iVar1 = Vec_PtrSize(p->vClassOld);
    if (iVar1 < 1) {
      __assert_fail("Vec_PtrSize(p->vClassOld) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                    ,0x1cf,"int Dch_ClassesRefineOneClass(Dch_Cla_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Vec_PtrSize(p->vClassNew);
    if (iVar1 < 1) {
      __assert_fail("Vec_PtrSize(p->vClassNew) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                    ,0x1d0,"int Dch_ClassesRefineOneClass(Dch_Cla_t *, Aig_Obj_t *, int)");
    }
    pClass = Dch_ObjRemoveClass(p,pReprOld);
    for (local_4c = 0; iVar1 = Vec_PtrSize(p->vClassOld), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassOld,local_4c);
      pClass[local_4c] = pAVar3;
      local_70 = pReprOld;
      if (local_4c == 0) {
        local_70 = (Aig_Obj_t *)0x0;
      }
      Aig_ObjSetRepr(p->pAig,pAVar3,local_70);
    }
    lVar4 = (long)local_4c;
    for (local_4c = 0; iVar1 = Vec_PtrSize(p->vClassNew), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,local_4c);
      (pClass + lVar4)[local_4c] = pAVar3;
      local_90 = pAVar2;
      if (local_4c == 0) {
        local_90 = (Aig_Obj_t *)0x0;
      }
      Aig_ObjSetRepr(p->pAig,pAVar3,local_90);
    }
    iVar1 = Vec_PtrSize(p->vClassOld);
    if (1 < iVar1) {
      iVar1 = Vec_PtrSize(p->vClassOld);
      Dch_ObjAddClass(p,pReprOld,pClass,iVar1);
    }
    iVar1 = Vec_PtrSize(p->vClassNew);
    if (1 < iVar1) {
      iVar1 = Vec_PtrSize(p->vClassNew);
      Dch_ObjAddClass(p,pAVar2,pClass + lVar4,iVar1);
    }
    if ((fRecursive == 0) || (iVar1 = Vec_PtrSize(p->vClassNew), iVar1 < 2)) {
      p_local._4_4_ = 1;
    }
    else {
      iVar1 = Dch_ClassesRefineOneClass(p,pAVar2,1);
      p_local._4_4_ = iVar1 + 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dch_ClassesRefineOneClass( Dch_Cla_t * p, Aig_Obj_t * pReprOld, int fRecursive )
{
    Aig_Obj_t ** pClassOld, ** pClassNew;
    Aig_Obj_t * pObj, * pReprNew;
    int i;

    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Dch_ClassForEachNode( p, pReprOld, pObj, i )
        if ( p->pFuncNodesAreEqual(p->pManData, pReprOld, pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
    // check if splitting happened
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;

    // get the new representative
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    assert( Vec_PtrSize(p->vClassOld) > 0 );
    assert( Vec_PtrSize(p->vClassNew) > 0 );

    // create old class
    pClassOld = Dch_ObjRemoveClass( p, pReprOld );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        pClassOld[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprOld : NULL );
    }
    // create new class
    pClassNew = pClassOld + i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        pClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }

    // put classes back
    if ( Vec_PtrSize(p->vClassOld) > 1 )
        Dch_ObjAddClass( p, pReprOld, pClassOld, Vec_PtrSize(p->vClassOld) );
    if ( Vec_PtrSize(p->vClassNew) > 1 )
        Dch_ObjAddClass( p, pReprNew, pClassNew, Vec_PtrSize(p->vClassNew) );

    // check if the class should be recursively refined
    if ( fRecursive && Vec_PtrSize(p->vClassNew) > 1 )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}